

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O0

ion_err_t lfb_get(ion_lfb_t *bag,ion_file_offset_t offset,uint num_bytes,ion_byte_t *write_to,
                 ion_file_offset_t *next)

{
  ion_err_t error;
  ion_file_offset_t *next_local;
  ion_byte_t *write_to_local;
  uint num_bytes_local;
  ion_file_offset_t offset_local;
  ion_lfb_t *bag_local;
  
  bag_local._7_1_ = ion_fread_at(bag->file_handle,offset,8,(ion_byte_t *)next);
  if (bag_local._7_1_ == '\0') {
    bag_local._7_1_ = ion_fread_at(bag->file_handle,offset + 8,num_bytes,write_to);
  }
  return bag_local._7_1_;
}

Assistant:

ion_err_t
lfb_get(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*write_to,
	ion_file_offset_t	*next
) {
	ion_err_t error;

	error = ion_fread_at(bag->file_handle, offset, sizeof(ion_file_offset_t), (ion_byte_t *) next);

	if (err_ok != error) {
		return error;
	}

	error = ion_fread_at(bag->file_handle, offset + sizeof(ion_file_offset_t), num_bytes, write_to);

	return error;
}